

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_request
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  undefined8 *puVar1;
  ngx_str_t *s;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  puVar1 = (undefined8 *)((long)&r->signature + data);
  if (puVar1[1] == 0) {
    *(uint *)v = *(uint *)v & 0xbfffffff | 0x40000000;
  }
  else {
    *(uint *)v = *(uint *)v & 0xf0000000 | (uint)*puVar1 & 0xfffffff;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = (u_char *)puVar1[1];
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_request(ngx_http_request_t *r, ngx_http_variable_value_t *v,
    uintptr_t data)
{
    ngx_str_t  *s;

    s = (ngx_str_t *) ((char *) r + data);

    if (s->data) {
        v->len = s->len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = s->data;

    } else {
        v->not_found = 1;
    }

    return NGX_OK;
}